

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseIntegerProperty
               (int *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  char *member;
  ulong uVar2;
  json *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d5;
  int local_d4;
  undefined1 local_d0 [3];
  bool isInt;
  int intValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  json_const_iterator it;
  string *parent_node_local;
  bool required_local;
  string *property_local;
  json *o_local;
  string *err_local;
  int *ret_local;
  
  it.m_it.primitive_iterator.m_it = (difference_type)parent_node;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_60);
  member = (char *)std::__cxx11::string::c_str();
  bVar1 = anon_unknown_57::FindMember(o,member,(json_const_iterator *)local_60);
  if (bVar1) {
    o_00 = anon_unknown_57::GetValue((json_const_iterator *)local_60);
    local_d5 = anon_unknown_57::GetInt(o_00,&local_d4);
    if ((bool)local_d5) {
      if (ret != (int *)0x0) {
        *ret = local_d4;
      }
      ret_local._7_1_ = true;
    }
    else {
      if ((required) && (err != (string *)0x0)) {
        std::operator+(&local_118,"\'",property);
        std::operator+(&local_f8,&local_118,"\' property is not an integer type.\n");
        std::__cxx11::string::operator+=((string *)err,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
      }
      ret_local._7_1_ = false;
    }
  }
  else {
    if ((required) && (err != (string *)0x0)) {
      std::operator+(&local_a0,"\'",property);
      std::operator+(&local_80,&local_a0,"\' property is missing");
      std::__cxx11::string::operator+=((string *)err,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ," in ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               it.m_it.primitive_iterator.m_it);
        std::__cxx11::string::operator+=((string *)err,(string *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
      }
      std::__cxx11::string::operator+=((string *)err,".\n");
    }
    ret_local._7_1_ = false;
  }
  return ret_local._7_1_;
}

Assistant:

static bool ParseIntegerProperty(int *ret, std::string *err, const json &o,
                                 const std::string &property,
                                 const bool required,
                                 const std::string &parent_node = "") {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  int intValue;
  bool isInt = GetInt(GetValue(it), intValue);
  if (!isInt) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not an integer type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = intValue;
  }

  return true;
}